

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Purpose purpose)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "default";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "render";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "proxy";
    paVar1 = &local_c;
    break;
  case 3:
    pcVar2 = "guide";
    paVar1 = &local_b;
    break;
  default:
    pcVar2 = "[[Invalid Purpose value]]";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Purpose purpose) {
  switch (purpose) {
    case Purpose::Default: {
      return "default";
    }
    case Purpose::Render: {
      return "render";
    }
    case Purpose::Guide: {
      return "guide";
    }
    case Purpose::Proxy: {
      return "proxy";
    }
  }

  // Never reach here though
  return "[[Invalid Purpose value]]";
}